

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_receive_unfragmented_frames(void)

{
  uint length;
  frame_direction fVar1;
  cio_error cVar2;
  uint local_a4;
  uint local_a0;
  uint l;
  uint data_frame_call_count;
  cio_error err;
  ws_frame frames [2];
  char *data;
  frame_direction dir;
  uint frame_type;
  uint32_t frame_size;
  uint k;
  uint j;
  uint i;
  frame_direction dirs [2];
  uint frame_types [2];
  uint32_t frame_sizes [7];
  
  frame_types[0] = 0;
  frame_types[1] = 1;
  dirs[0] = 2;
  dirs[1] = FROM_SERVER;
  _j = 0x100000000;
  k = 0;
  do {
    if (6 < k) {
      return;
    }
    for (frame_size = 0; frame_size < 2; frame_size = frame_size + 1) {
      for (frame_type = 0; frame_type < 2; frame_type = frame_type + 1) {
        length = frame_types[k];
        fVar1 = dirs[frame_size];
        cVar2 = (&j)[frame_type];
        frames[1]._24_8_ = malloc((ulong)length);
        memset((void *)frames[1]._24_8_,0x61,(ulong)length);
        frames[0]._0_8_ = frames[1]._24_8_;
        frames[0].data = (void *)(ulong)length;
        frames[0].data_length._0_1_ = 1;
        frames[0].data_length._1_1_ = 0;
        frames[0].last_frame = true;
        frames[0].rsv = false;
        frames[0]._26_2_ = 0;
        frames[1].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
        frames[1].direction = FROM_CLIENT;
        frames[1].data = (void *)0x0;
        frames[1].data_length._0_1_ = 1;
        frames[1].data_length._1_1_ = 0;
        data_frame_call_count = fVar1;
        err = cVar2;
        frames[0]._28_4_ = cVar2;
        serialize_frames((ws_frame *)&data_frame_call_count,2);
        *(ushort *)&(ws->ws_private).ws_flags =
             *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(cVar2 == CIO_SUCCESS) << 10;
        cVar2 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
        UnityAssertEqualNumber
                  (0,(long)cVar2,"Could not start reading a message!",0x27f,UNITY_DISPLAY_STYLE_INT)
        ;
        UnityAssertGreaterOrLessOrEqualNumber
                  (2,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
                   "read_handler was not called often enough",0x281,UNITY_DISPLAY_STYLE_INT);
        if (read_handler_fake.arg_histories_dropped == 0) {
          UnityAssertEqualNumber
                    (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
                     "read_handler wast not called with CIO_EOF",0x285,UNITY_DISPLAY_STYLE_INT);
          local_a0 = read_handler_fake.call_count - 1;
        }
        else {
          local_a0 = 0x32;
        }
        for (local_a4 = 0; local_a4 < local_a0; local_a4 = local_a4 + 1) {
          UnityAssertEqualNumber
                    ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[local_a4],
                     "websocket parameter of read_handler not correct",0x28c,UNITY_DISPLAY_STYLE_INT
                    );
          if (read_handler_fake.arg1_history[local_a4] != (void *)0x0) {
            UnityFail("context of read handler not NULL",0x28d);
          }
          UnityAssertEqualNumber
                    (0,(long)read_handler_fake.arg2_history[local_a4],
                     "error parameter of read_handler not CIO_SUCCESS",0x28e,UNITY_DISPLAY_STYLE_INT
                    );
          UnityAssertGreaterOrLessOrEqualNumber
                    ((ulong)length,read_handler_fake.arg3_history[local_a4],UNITY_SMALLER_OR_EQUAL,
                     "remaining length parameter of read_handler not less or equal to frame_size",
                     0x28f,UNITY_DISPLAY_STYLE_INT);
          UnityAssertGreaterOrLessOrEqualNumber
                    ((ulong)length,read_handler_fake.arg5_history[local_a4],UNITY_SMALLER_OR_EQUAL,
                     "chunk length parameter of read_handler not less or equal to frame_size",0x290,
                     UNITY_DISPLAY_STYLE_INT);
          if ((read_handler_fake.arg7_history[local_a4] & 1U) == 0) {
            UnityFail("last_frame parameter of read_handler not true",0x291);
          }
          UnityAssertEqualNumber
                    ((long)(int)(uint)(fVar1 == 2),
                     (ulong)(read_handler_fake.arg8_history[local_a4] & 1),
                     "is_binary argument not not correct",0x292,UNITY_DISPLAY_STYLE_INT);
        }
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0x295,
                   UNITY_DISPLAY_STYLE_INT);
        if (length != 0) {
          UnityAssertEqualMemory
                    ((void *)frames[1]._24_8_,read_back_buffer,length,1,
                     "data in read_handler not correct",0x297,UNITY_ARRAY_TO_ARRAY);
        }
        UnityAssertEqualNumber
                  (1,(ulong)on_control_fake.call_count,
                   "control callback was not called for last close frame",0x29a,
                   UNITY_DISPLAY_STYLE_INT);
        if (on_control_fake.arg0_val == (cio_websocket *)0x0) {
          UnityFail("websocket parameter of control callback is NULL",0x29b);
        }
        UnityAssertEqualNumber
                  (8,(ulong)on_control_fake.arg1_val,
                   "websocket parameter of control callback is NULL",0x29c,UNITY_DISPLAY_STYLE_INT);
        if (on_control_fake.arg2_val != (uint8_t *)0x0) {
          UnityFail("data parameter of control callback is not correct",0x29d);
        }
        UnityAssertEqualNumber
                  (0,(ulong)on_control_fake.arg3_val,
                   "data length parameter of control callback is not correct",0x29e,
                   UNITY_DISPLAY_STYLE_INT);
        if (frames[1]._24_8_ != 0) {
          free((void *)frames[1]._24_8_);
        }
        free(ws);
        setUp();
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void test_receive_unfragmented_frames(void)
{
	uint32_t frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction dirs[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(frame_types); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(dirs); k++) {
				uint32_t frame_size = frame_sizes[i];
				unsigned int frame_type = frame_types[j];
				enum frame_direction dir = dirs[k];

				char *data = malloc(frame_size);
				memset(data, 'a', frame_size);
				struct ws_frame frames[] = {
				    {.frame_type = frame_type, .direction = dir, .data = data, .data_length = frame_size, .last_frame = true, .rsv = false},
				    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = dir, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
				};

				serialize_frames(frames, ARRAY_SIZE(frames));

				ws->ws_private.ws_flags.is_server = (dir == FROM_CLIENT) ? 1 : 0;
				enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

				TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(2, read_handler_fake.call_count, "read_handler was not called often enough");

				unsigned int data_frame_call_count;
				if (read_handler_fake.arg_histories_dropped == 0) {
					TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "read_handler wast not called with CIO_EOF");
					data_frame_call_count = read_handler_fake.call_count - 1;
				} else {
					data_frame_call_count = FFF_ARG_HISTORY_LEN;
				}

				for (unsigned int l = 0; l < data_frame_call_count; l++) {
					TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_history[l], "websocket parameter of read_handler not correct");
					TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[l], "context of read handler not NULL");
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[l], "error parameter of read_handler not CIO_SUCCESS");
					TEST_ASSERT_LESS_OR_EQUAL_MESSAGE(frame_size, read_handler_fake.arg3_history[l], "remaining length parameter of read_handler not less or equal to frame_size");
					TEST_ASSERT_LESS_OR_EQUAL_MESSAGE(frame_size, read_handler_fake.arg5_history[l], "chunk length parameter of read_handler not less or equal to frame_size");
					TEST_ASSERT_TRUE_MESSAGE(read_handler_fake.arg7_history[l], "last_frame parameter of read_handler not true");
					TEST_ASSERT_EQUAL_MESSAGE(frame_type == CIO_WEBSOCKET_BINARY_FRAME, read_handler_fake.arg8_history[l], "is_binary argument not not correct");
				}

				TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
				if (frame_size > 0) {
					TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, frame_size, "data in read_handler not correct");
				}

				TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was not called for last close frame");
				TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_val, "websocket parameter of control callback is NULL");
				TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "websocket parameter of control callback is NULL");
				TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_val, "data parameter of control callback is not correct");
				TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_val, "data length parameter of control callback is not correct");

				if (data) {
					free(data);
				}

				free(ws);
				setUp();
			}
		}
	}
}